

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint32_t helper_neon_sqadd_u8_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (int)(char)b + (a & 0xff);
  if ((int)uVar1 < 0x80) {
    uVar1 = uVar1 & 0xff;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar1 = 0x7f;
  }
  uVar2 = (int)(char)(b >> 8) + (a >> 8 & 0xff);
  if ((int)uVar2 < 0x80) {
    uVar2 = (uVar2 & 0xff) << 8;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar2 = 0x7f00;
  }
  uVar5 = (int)(char)(b >> 0x10) + (a >> 0x10 & 0xff);
  if ((int)uVar5 < 0x80) {
    uVar5 = (uVar5 & 0xff) << 0x10;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar5 = 0x7f0000;
  }
  iVar3 = ((int)b >> 0x18) + (a >> 0x18);
  if (iVar3 < 0x80) {
    uVar4 = iVar3 * 0x1000000;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar4 = 0x7f000000;
  }
  return uVar2 | uVar1 | uVar5 | uVar4;
}

Assistant:

uint32_t HELPER(neon_sqadd_u8)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int16_t va, vb, vr;
    uint32_t r = 0;

    SSATACC(8, 0);
    SSATACC(8, 8);
    SSATACC(8, 16);
    SSATACC(8, 24);
    return r;
}